

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

void enet_peer_remove_incoming_commands
               (ENetList *queue,ENetListIterator startCommand,ENetListIterator endCommand,
               ENetIncomingCommand *excludeCommand)

{
  uint32_t *puVar1;
  _ENetListNode *p_Var2;
  ENetPacket *packet;
  ENetIncomingCommand *incomingCommand;
  ENetListIterator pEVar3;
  
  while (pEVar3 = &queue->sentinel, pEVar3 != startCommand) {
    queue = (ENetList *)pEVar3->next;
    if (pEVar3 != endCommand) {
      p_Var2 = pEVar3->previous;
      p_Var2->next = (_ENetListNode *)queue;
      ((_ENetListNode *)queue)->previous = p_Var2;
      packet = (ENetPacket *)pEVar3[5].previous;
      if (packet != (ENetPacket *)0x0) {
        puVar1 = &packet->referenceCount;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          enet_packet_destroy(packet);
        }
      }
      if (pEVar3[5].next != (_ENetListNode *)0x0) {
        (*(code *)callbacks_1)();
      }
      (*(code *)callbacks_1)(pEVar3);
    }
  }
  return;
}

Assistant:

static void enet_peer_remove_incoming_commands(ENetList* queue, ENetListIterator startCommand, ENetListIterator endCommand, ENetIncomingCommand* excludeCommand) {
	ENetListIterator currentCommand;

	for (currentCommand = startCommand; currentCommand != endCommand;) {
		ENetIncomingCommand* incomingCommand = (ENetIncomingCommand*)currentCommand;
		currentCommand = enet_list_next(currentCommand);

		if (incomingCommand == excludeCommand)
			continue;

		enet_list_remove(&incomingCommand->incomingCommandList);

		if (incomingCommand->packet != NULL) {
			--incomingCommand->packet->referenceCount;

			if (incomingCommand->packet->referenceCount == 0)
				enet_packet_destroy(incomingCommand->packet);
		}

		if (incomingCommand->fragments != NULL)
			enet_free(incomingCommand->fragments);

		enet_free(incomingCommand);
	}
}